

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

int eval_relational_expr
              (lyxp_expr *exp,uint16_t *exp_idx,lyd_node *cur_node,lys_module *param_4,lyxp_set *set
              ,int options)

{
  uint uVar1;
  lyxp_token *plVar2;
  bool bVar3;
  ushort uVar4;
  int iVar5;
  char *pcVar6;
  ulong uVar7;
  ushort uVar8;
  char *pcVar9;
  long lVar10;
  ushort uVar11;
  lyxp_set *trg;
  undefined1 auStack_c8 [8];
  lyxp_set set2;
  lyxp_set orig_set;
  
  set2.ctx_pos = 0;
  set2.ctx_size = 0;
  auStack_c8 = (undefined1  [8])0x0;
  set2.type = LYXP_SET_EMPTY;
  set2._4_4_ = 0;
  set2._8_8_ = 0;
  set2.val.nodes = (lyxp_set_nodes *)0x0;
  set2.val._8_8_ = 0;
  set2.used = 0;
  set2.size = 0;
  plVar2 = (&((lyxp_expr *)exp->repeat)->tokens)[*exp_idx];
  if (plVar2 == (lyxp_token *)0x0) {
LAB_00168bea:
    iVar5 = eval_additive_expr(exp,exp_idx,cur_node,param_4,set,options);
    if (iVar5 == 0) goto LAB_00168c0b;
  }
  else {
    uVar11 = 0;
    do {
      uVar7 = (ulong)uVar11;
      uVar11 = uVar11 + 1;
    } while (*(char *)((long)plVar2 + uVar7 + 1) != '\0');
    uVar7 = (ulong)*(byte *)((long)plVar2 + uVar7);
    if (((uVar7 == 0) || (exp->tokens[uVar7] != LYXP_TOKEN_OPERATOR_COMP)) ||
       ((byte)(exp->expr[exp->expr_pos[uVar7]] | 2U) != 0x3e)) goto LAB_00168bea;
    exp_repeat_pop((lyxp_expr *)exp->repeat,*exp_idx);
    trg = (lyxp_set *)&set2.ctx_pos;
    set_fill_set(trg,set);
    iVar5 = eval_additive_expr(exp,exp_idx,cur_node,param_4,set,options);
    if (iVar5 != 0) goto LAB_00168c14;
    pcVar9 = "parsed";
    if (set == (lyxp_set *)0x0) {
      pcVar9 = "skipped";
    }
    do {
      uVar11 = *exp_idx;
      uVar4 = uVar11;
      if ('\x02' < ly_log_level) {
        pcVar6 = print_token(exp->tokens[uVar11]);
        ly_log_dbg(LY_LDGXPATH,"%-27s %s %s[%u]","eval_relational_expr",pcVar9,pcVar6,
                   (ulong)exp->expr_pos[*exp_idx]);
        uVar4 = *exp_idx;
      }
      uVar4 = uVar4 + 1;
      *exp_idx = uVar4;
      plVar2 = (&((lyxp_expr *)exp->repeat)->tokens)[uVar4];
      bVar3 = true;
      if (plVar2 != (lyxp_token *)0x0) {
        uVar8 = 0;
        do {
          uVar7 = (ulong)uVar8;
          uVar8 = uVar8 + 1;
        } while (*(char *)((long)plVar2 + uVar7 + 1) != '\0');
        uVar7 = (ulong)*(byte *)((long)plVar2 + uVar7);
        if (((uVar7 != 0) && (exp->tokens[uVar7] == LYXP_TOKEN_OPERATOR_COMP)) &&
           ((byte)(exp->expr[exp->expr_pos[uVar7]] | 2U) == 0x3e)) {
          exp_repeat_pop((lyxp_expr *)exp->repeat,uVar4);
          bVar3 = false;
        }
      }
      if (set == (lyxp_set *)0x0) {
        iVar5 = eval_additive_expr(exp,exp_idx,cur_node,param_4,(lyxp_set *)0x0,options);
        if (iVar5 != 0) {
          return iVar5;
        }
      }
      else {
        set_fill_set((lyxp_set *)auStack_c8,(lyxp_set *)&set2.ctx_pos);
        iVar5 = eval_additive_expr(exp,exp_idx,cur_node,param_4,(lyxp_set *)auStack_c8,options);
        if (iVar5 != 0) {
          lyxp_set_cast((lyxp_set *)&set2.ctx_pos,LYXP_SET_EMPTY,cur_node,param_4,options);
LAB_00168c7e:
          trg = (lyxp_set *)auStack_c8;
          goto LAB_00168c14;
        }
        if ((options & 0x1cU) == 0) {
          iVar5 = moveto_op_comp(set,(lyxp_set *)auStack_c8,exp->expr + exp->expr_pos[uVar11],
                                 cur_node,param_4,options);
          if (iVar5 != 0) {
            lyxp_set_cast((lyxp_set *)&set2.ctx_pos,LYXP_SET_EMPTY,cur_node,param_4,options);
            iVar5 = -1;
            goto LAB_00168c7e;
          }
        }
        else {
          set_snode_merge(set,(lyxp_set *)auStack_c8);
          uVar1 = set->used;
          if ((ulong)uVar1 != 0) {
            lVar10 = 0;
            do {
              if (*(int *)((long)&((set->val).nodes)->pos + lVar10) == 1) {
                *(undefined4 *)((long)&((set->val).nodes)->pos + lVar10) = 0;
              }
              lVar10 = lVar10 + 0x10;
            } while ((ulong)uVar1 << 4 != lVar10);
          }
        }
      }
    } while (!bVar3);
LAB_00168c0b:
    iVar5 = 0;
  }
  trg = (lyxp_set *)&set2.ctx_pos;
LAB_00168c14:
  lyxp_set_cast(trg,LYXP_SET_EMPTY,cur_node,param_4,options);
  return iVar5;
}

Assistant:

static int
eval_relational_expr(struct lyxp_expr *exp, uint16_t *exp_idx, struct lyd_node *cur_node, struct lys_module *local_mod,
                     struct lyxp_set *set, int options)
{
    int ret;
    uint16_t this_op, op_exp;
    struct lyxp_set orig_set, set2;

    memset(&orig_set, 0, sizeof orig_set);
    memset(&set2, 0, sizeof set2);

    op_exp = exp_repeat_peek(exp, *exp_idx);
    if (op_exp && (exp->tokens[op_exp] == LYXP_TOKEN_OPERATOR_COMP)
            && ((exp->expr[exp->expr_pos[op_exp]] == '<') || (exp->expr[exp->expr_pos[op_exp]] == '>'))) {
        /* there is an operator */
        exp_repeat_pop(exp, *exp_idx);
        set_fill_set(&orig_set, set);
    } else {
        op_exp = 0;
    }

    /* AdditiveExpr */
    ret = eval_additive_expr(exp, exp_idx, cur_node, local_mod, set, options);
    if (ret) {
        lyxp_set_cast(&orig_set, LYXP_SET_EMPTY, cur_node, local_mod, options);
        return ret;
    }

    /* ('<' / '>' / '<=' / '>=' AdditiveExpr)* */
    while (op_exp) {
        this_op = *exp_idx;

        LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (set ? "parsed" : "skipped"),
               print_token(exp->tokens[*exp_idx]), exp->expr_pos[*exp_idx]);
        ++(*exp_idx);

        op_exp = exp_repeat_peek(exp, *exp_idx);
        if (op_exp && (exp->tokens[op_exp] == LYXP_TOKEN_OPERATOR_COMP)
                && ((exp->expr[exp->expr_pos[op_exp]] == '<') || (exp->expr[exp->expr_pos[op_exp]] == '>'))) {
            /* there is another operator */
            exp_repeat_pop(exp, *exp_idx);
        } else {
            op_exp = 0;
        }

        if (!set) {
            ret = eval_additive_expr(exp, exp_idx, cur_node, local_mod, NULL, options);
            if (ret) {
                return ret;
            }
            continue;
        }

        set_fill_set(&set2, &orig_set);
        ret = eval_additive_expr(exp, exp_idx, cur_node, local_mod, &set2, options);
        if (ret) {
            lyxp_set_cast(&orig_set, LYXP_SET_EMPTY, cur_node, local_mod, options);
            lyxp_set_cast(&set2, LYXP_SET_EMPTY, cur_node, local_mod, options);
            return ret;
        }

        /* eval */
        if (options & LYXP_SNODE_ALL) {
            set_snode_merge(set, &set2);
            set_snode_clear_ctx(set);
        } else {
            if (moveto_op_comp(set, &set2, &exp->expr[exp->expr_pos[this_op]], cur_node, local_mod, options)) {
                lyxp_set_cast(&orig_set, LYXP_SET_EMPTY, cur_node, local_mod, options);
                lyxp_set_cast(&set2, LYXP_SET_EMPTY, cur_node, local_mod, options);
                return -1;
            }
        }
    }

    lyxp_set_cast(&orig_set, LYXP_SET_EMPTY, cur_node, local_mod, options);
    return EXIT_SUCCESS;
}